

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O0

void __thiscall helics::TimeoutMonitor::reset(TimeoutMonitor *this)

{
  bool bVar1;
  iterator __lhs;
  long in_RDI;
  linkConnection *conn;
  iterator __end1;
  iterator __begin1;
  vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *__range1;
  reference in_stack_ffffffffffffffd8;
  __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
  local_18;
  long local_10;
  
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  local_10 = in_RDI + 0x28;
  local_18._M_current =
       (linkConnection *)
       std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::begin
                 ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *)
                  in_stack_ffffffffffffffd8);
  __lhs = std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::end
                    ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *)
                     in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                      ((__normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd8 =
         __gnu_cxx::
         __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
         ::operator*(&local_18);
    in_stack_ffffffffffffffd8->waitingForPingReply = false;
    __gnu_cxx::
    __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void TimeoutMonitor::reset()
{
    parentConnection.waitingForPingReply = false;
    waitingForConnection = false;
    for (auto& conn : connections) {
        conn.waitingForPingReply = false;
    }
}